

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v64 c_v64_shr_s8(c_v64 a,uint n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  c_v64 extraout_RAX;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  
  auVar3 = in_ZMM0._0_16_;
  if (7 < n) {
    c_v64_shr_s8();
    auVar1 = vpunpcklbw_avx(auVar3,auVar3);
    auVar1 = vpsraw_avx(auVar1,ZEXT416(n + 8));
    vpacksswb_avx(auVar1,auVar3);
    return (c_v64)extraout_RAX.u64;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = a.u64;
  auVar2 = vpmovsxbd_avx2(auVar3);
  auVar2 = vpsrad_avx2(auVar2,ZEXT416(n));
  auVar3 = vpackssdw_avx(auVar2._0_16_,auVar2._16_16_);
  auVar3 = vpacksswb_avx(auVar3,auVar3);
  return (c_v64)auVar3._0_8_;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_s8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined s8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.s8[c] = a.s8[c] >> n;
  return t;
}